

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

Rect<int> eos::render::detail::calculate_clipped_bounding_box<float>
                    (Vector2<float> *v0,Vector2<float> *v1,Vector2<float> *v2,int viewport_width,
                    int viewport_height)

{
  float __x;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Rect<int> RVar9;
  
  fVar5 = (v0->super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
          [0];
  fVar7 = (v0->super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
          [1];
  fVar1 = floorf(fVar5);
  fVar4 = (v1->super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
          [0];
  fVar8 = (v1->super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
          [1];
  fVar2 = floorf(fVar4);
  fVar6 = (v2->super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
          [0];
  __x = (v2->super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>).m_storage.m_data.array[1];
  fVar3 = floorf(fVar6);
  if (fVar2 <= fVar3) {
    fVar3 = fVar2;
  }
  if (fVar1 <= fVar3) {
    fVar3 = fVar1;
  }
  fVar1 = 0.0;
  if (0.0 <= fVar3) {
    fVar1 = fVar3;
  }
  fVar3 = ceilf(fVar5);
  fVar4 = ceilf(fVar4);
  fVar5 = ceilf(fVar6);
  if (fVar5 <= fVar4) {
    fVar5 = fVar4;
  }
  if (fVar5 <= fVar3) {
    fVar5 = fVar3;
  }
  fVar4 = (float)(viewport_width + -1);
  if (fVar5 <= (float)(viewport_width + -1)) {
    fVar4 = fVar5;
  }
  fVar6 = floorf(fVar7);
  fVar3 = floorf(fVar8);
  fVar5 = floorf(__x);
  if (fVar3 <= fVar5) {
    fVar5 = fVar3;
  }
  if (fVar6 <= fVar5) {
    fVar5 = fVar6;
  }
  fVar6 = 0.0;
  if (0.0 <= fVar5) {
    fVar6 = fVar5;
  }
  fVar7 = ceilf(fVar7);
  fVar8 = ceilf(fVar8);
  fVar5 = ceilf(__x);
  if (fVar5 <= fVar8) {
    fVar5 = fVar8;
  }
  if (fVar5 <= fVar7) {
    fVar5 = fVar7;
  }
  fVar7 = (float)(viewport_height + -1);
  if (fVar5 <= (float)(viewport_height + -1)) {
    fVar7 = fVar5;
  }
  RVar9.y = (int)fVar6;
  RVar9.x = (int)fVar1;
  RVar9.height = (int)fVar7 - (int)fVar6;
  RVar9.width = (int)fVar4 - (int)fVar1;
  return RVar9;
}

Assistant:

core::Rect<int> calculate_clipped_bounding_box(const Eigen::Vector2<T>& v0, const Eigen::Vector2<T>& v1,
                                               const Eigen::Vector2<T>& v2, int viewport_width,
                                               int viewport_height)
{
    /* Old, producing artifacts:
    t.minX = max(min(t.v0.position[0], min(t.v1.position[0], t.v2.position[0])), 0.0f);
    t.maxX = min(max(t.v0.position[0], max(t.v1.position[0], t.v2.position[0])), (float)(viewportWidth - 1));
    t.minY = max(min(t.v0.position[1], min(t.v1.position[1], t.v2.position[1])), 0.0f);
    t.maxY = min(max(t.v0.position[1], max(t.v1.position[1], t.v2.position[1])), (float)(viewportHeight -
    1));*/

    using std::ceil;
    using std::floor;
    using std::max;
    using std::min;
    // Readded this comment after merge: What about rounding, or rather the conversion from double to int?
    const int minX = max(min(floor(v0[0]), min(floor(v1[0]), floor(v2[0]))), T(0));
    const int maxX = min(max(ceil(v0[0]), max(ceil(v1[0]), ceil(v2[0]))), static_cast<T>(viewport_width - 1));
    const int minY = max(min(floor(v0[1]), min(floor(v1[1]), floor(v2[1]))), T(0));
    const int maxY = min(max(ceil(v0[1]), max(ceil(v1[1]), ceil(v2[1]))), static_cast<T>(viewport_height - 1));
    return core::Rect<int>{minX, minY, maxX - minX, maxY - minY};
}